

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O3

void anon_unknown.dwarf_1c2de7::fillPixels<half>
               (Array2D<unsigned_int> *sampleCount,Array2D<half_*> *ph,int width,int height)

{
  unsigned_short uVar1;
  ulong uVar2;
  half **pphVar3;
  half *phVar4;
  uint *puVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  float i;
  uif x;
  
  uVar2 = (long)height * (long)width;
  pphVar3 = (half **)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
  if (ph->_data != (half **)0x0) {
    operator_delete__(ph->_data);
  }
  ph->_sizeX = (long)height;
  ph->_sizeY = (long)width;
  ph->_data = pphVar3;
  if (0 < height) {
    uVar2 = 0;
    do {
      if (0 < width) {
        lVar7 = sampleCount->_sizeY;
        puVar5 = sampleCount->_data;
        uVar9 = 0;
        do {
          phVar4 = (half *)operator_new__((ulong)puVar5[lVar7 * uVar2 + uVar9] * 2);
          ph->_data[ph->_sizeY * uVar2 + uVar9] = phVar4;
          puVar5 = sampleCount->_data;
          if (puVar5[lVar7 * uVar2 + uVar9] != 0) {
            uVar8 = (uint)((int)uVar9 + (int)uVar2 * width) % 0x801;
            i = (float)uVar8;
            uVar6 = 0;
            do {
              phVar4 = ph->_data[ph->_sizeY * uVar2 + uVar9];
              if (uVar8 == 0) {
                uVar1 = (unsigned_short)((uint)i >> 0x10);
              }
              else if (half::_eLut[(uint)i >> 0x17] == 0) {
                uVar1 = half::convert((int)i);
                lVar7 = sampleCount->_sizeY;
                puVar5 = sampleCount->_data;
              }
              else {
                uVar1 = half::_eLut[(uint)i >> 0x17] +
                        (short)(((uint)i & 0x7fffff) + 0xfff + (uint)(((uint)i >> 0xd & 1) != 0) >>
                               0xd);
              }
              phVar4[uVar6]._h = uVar1;
              uVar6 = uVar6 + 1;
            } while (uVar6 < puVar5[lVar7 * uVar2 + uVar9]);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != (uint)width);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)height);
  }
  return;
}

Assistant:

void fillPixels (Array2D<unsigned int>& sampleCount, Array2D<T*> &ph, int width, int height)
{
    ph.resizeErase(height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            ph[y][x] = new T[sampleCount[y][x]];
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                //
                // We do this because half cannot store number bigger than 2048 exactly.
                //
                ph[y][x][i] = (y * width + x) % 2049;
            }
        }
}